

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O2

bool __thiscall DIS::AggregateStatePdu::operator==(AggregateStatePdu *this,AggregateStatePdu *rhs)

{
  uint uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uint uVar6;
  pointer pAVar7;
  pointer pEVar8;
  pointer pEVar9;
  pointer pVVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  size_t idx_2;
  size_t idx;
  ulong uVar19;
  long lVar20;
  
  bVar11 = EntityManagementFamilyPdu::operator==
                     (&this->super_EntityManagementFamilyPdu,&rhs->super_EntityManagementFamilyPdu);
  bVar12 = EntityID::operator==(&this->_aggregateID,&rhs->_aggregateID);
  uVar2 = this->_forceID;
  uVar3 = rhs->_forceID;
  uVar4 = rhs->_aggregateState;
  uVar5 = this->_aggregateState;
  bVar13 = EntityType::operator==(&this->_aggregateType,&rhs->_aggregateType);
  uVar6 = this->_formation;
  uVar1 = rhs->_formation;
  bVar14 = AggregateMarking::operator==(&this->_aggregateMarking,&rhs->_aggregateMarking);
  bVar15 = Vector3Float::operator==(&this->_dimensions,&rhs->_dimensions);
  bVar16 = Orientation::operator==(&this->_orientation,&rhs->_orientation);
  bVar17 = Vector3Double::operator==(&this->_centerOfMass,&rhs->_centerOfMass);
  bVar18 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  bVar11 = (uVar5 == uVar4 && (uVar2 == uVar3 && (bVar12 && bVar11))) &&
           (((bVar18 && bVar17) && (bVar16 && (bVar15 && bVar14))) && (uVar6 == uVar1 && bVar13));
  lVar20 = 0;
  for (uVar19 = 0;
      pAVar7 = (this->_aggregateIDList).
               super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar19 < (ulong)((long)(this->_aggregateIDList).
                             super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 4);
      uVar19 = uVar19 + 1) {
    bVar12 = AggregateID::operator==
                       ((AggregateID *)((long)&pAVar7->_vptr_AggregateID + lVar20),
                        (AggregateID *)
                        ((long)&((rhs->_aggregateIDList).
                                 super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_AggregateID +
                        lVar20));
    bVar11 = (bool)(bVar11 & bVar12);
    lVar20 = lVar20 + 0x10;
  }
  lVar20 = 0;
  for (uVar19 = 0;
      pEVar8 = (this->_entityIDList).
               super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar19 < (ulong)((long)(this->_entityIDList).
                             super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar8 >> 4);
      uVar19 = uVar19 + 1) {
    bVar12 = EntityID::operator==
                       ((EntityID *)((long)&pEVar8->_vptr_EntityID + lVar20),
                        (EntityID *)
                        ((long)&((rhs->_entityIDList).
                                 super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->_vptr_EntityID + lVar20)
                       );
    bVar11 = (bool)(bVar11 & bVar12);
    lVar20 = lVar20 + 0x10;
  }
  bVar11 = (bool)(this->_pad2 == rhs->_pad2 & bVar11);
  lVar20 = 0;
  for (uVar19 = 0;
      pEVar9 = (this->_silentAggregateSystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar19 < (ulong)((long)(this->_silentAggregateSystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 4);
      uVar19 = uVar19 + 1) {
    bVar12 = EntityType::operator==
                       ((EntityType *)((long)&pEVar9->_vptr_EntityType + lVar20),
                        (EntityType *)
                        ((long)&((rhs->_silentAggregateSystemList).
                                 super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_EntityType +
                        lVar20));
    bVar11 = (bool)(bVar11 & bVar12);
    lVar20 = lVar20 + 0x10;
  }
  lVar20 = 0;
  for (uVar19 = 0;
      pEVar9 = (this->_silentEntitySystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar19 < (ulong)((long)(this->_silentEntitySystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 4);
      uVar19 = uVar19 + 1) {
    bVar12 = EntityType::operator==
                       ((EntityType *)((long)&pEVar9->_vptr_EntityType + lVar20),
                        (EntityType *)
                        ((long)&((rhs->_silentEntitySystemList).
                                 super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_EntityType +
                        lVar20));
    bVar11 = (bool)(bVar11 & bVar12);
    lVar20 = lVar20 + 0x10;
  }
  lVar20 = 0;
  for (uVar19 = 0;
      pVVar10 = (this->_variableDatumList).
                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar19 < (ulong)(((long)(this->_variableDatumList).
                              super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10) / 0x30);
      uVar19 = uVar19 + 1) {
    bVar12 = VariableDatum::operator==
                       ((VariableDatum *)((long)&pVVar10->_vptr_VariableDatum + lVar20),
                        (VariableDatum *)
                        ((long)&((rhs->_variableDatumList).
                                 super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                        lVar20));
    bVar11 = (bool)(bVar11 & bVar12);
    lVar20 = lVar20 + 0x30;
  }
  return bVar11;
}

Assistant:

bool AggregateStatePdu::operator ==(const AggregateStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityManagementFamilyPdu::operator==(rhs);

     if( ! (_aggregateID == rhs._aggregateID) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_aggregateState == rhs._aggregateState) ) ivarsEqual = false;
     if( ! (_aggregateType == rhs._aggregateType) ) ivarsEqual = false;
     if( ! (_formation == rhs._formation) ) ivarsEqual = false;
     if( ! (_aggregateMarking == rhs._aggregateMarking) ) ivarsEqual = false;
     if( ! (_dimensions == rhs._dimensions) ) ivarsEqual = false;
     if( ! (_orientation == rhs._orientation) ) ivarsEqual = false;
     if( ! (_centerOfMass == rhs._centerOfMass) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _aggregateIDList.size(); idx++)
     {
        if( ! ( _aggregateIDList[idx] == rhs._aggregateIDList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _entityIDList.size(); idx++)
     {
        if( ! ( _entityIDList[idx] == rhs._entityIDList[idx]) ) ivarsEqual = false;
     }

     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _silentAggregateSystemList.size(); idx++)
     {
        if( ! ( _silentAggregateSystemList[idx] == rhs._silentAggregateSystemList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _silentEntitySystemList.size(); idx++)
     {
        if( ! ( _silentEntitySystemList[idx] == rhs._silentEntitySystemList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumList.size(); idx++)
     {
        if( ! ( _variableDatumList[idx] == rhs._variableDatumList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }